

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnFunctionSymbol
          (BinaryReaderObjdump *this,Index index,uint32_t flags,string_view name,Index func_index)

{
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  const_pointer pvVar4;
  string_view sVar5;
  BinaryReaderObjdump *local_48;
  char *local_40;
  Index func_index_local;
  uint32_t flags_local;
  Index index_local;
  BinaryReaderObjdump *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (BinaryReaderObjdump *)name._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar1) {
    sVar5 = BinaryReaderObjdumpBase::GetFunctionName
                      (&this->super_BinaryReaderObjdumpBase,func_index);
    local_48 = (BinaryReaderObjdump *)sVar5._M_len;
    this_local = local_48;
    local_40 = sVar5._M_str;
    name_local._M_len = (size_t)local_40;
  }
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  PrintDetails(this,"   - %d: F <%.*s> func=%u",(ulong)index,sVar3 & 0xffffffff,pvVar4,
               (ulong)func_index);
  RVar2 = PrintSymbolFlags(this,flags);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnFunctionSymbol(Index index,
                                             uint32_t flags,
                                             std::string_view name,
                                             Index func_index) {
  if (name.empty()) {
    name = GetFunctionName(func_index);
  }
  PrintDetails("   - %d: F <" PRIstringview "> func=%" PRIindex, index,
               WABT_PRINTF_STRING_VIEW_ARG(name), func_index);
  return PrintSymbolFlags(flags);
}